

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UdpBodySyntax::setChild(UdpBodySyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  SyntaxList<slang::syntax::UdpEntrySyntax> *pSVar4;
  UdpInitialStmtSyntax *pUVar5;
  logic_error *this_00;
  Token TVar6;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 5) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>>
                         (pSVar3);
      (this->portDecls).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->portDecls).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->portDecls).super_SyntaxListBase.childCount = (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->elements).size_;
      (this->portDecls).elements.data_ = (pSVar2->elements).data_;
      (this->portDecls).elements.size_ = sVar1;
      break;
    case 1:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pUVar5 = (UdpInitialStmtSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pUVar5 = SyntaxNode::as<slang::syntax::UdpInitialStmtSyntax>(pSVar3);
      }
      this->initialStmt = pUVar5;
      break;
    case 2:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->table).kind = TVar6.kind;
      (this->table).field_0x2 = TVar6._2_1_;
      (this->table).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->table).rawLen = TVar6.rawLen;
      (this->table).info = TVar6.info;
      break;
    case 3:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::UdpEntrySyntax>>(pSVar3);
      (this->entries).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->entries).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->entries).super_SyntaxListBase.childCount = (pSVar4->super_SyntaxListBase).childCount;
      sVar1 = (pSVar4->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>).size_;
      (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.data_ =
           (pSVar4->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>).data_;
      (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 4:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->endtable).kind = TVar6.kind;
      (this->endtable).field_0x2 = TVar6._2_1_;
      (this->endtable).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->endtable).rawLen = TVar6.rawLen;
      (this->endtable).info = TVar6.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x3358);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void UdpBodySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: portDecls = child.node()->as<SeparatedSyntaxList<UdpPortDeclSyntax>>(); return;
        case 1: initialStmt = child.node() ? &child.node()->as<UdpInitialStmtSyntax>() : nullptr; return;
        case 2: table = child.token(); return;
        case 3: entries = child.node()->as<SyntaxList<UdpEntrySyntax>>(); return;
        case 4: endtable = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}